

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void f1(int *a)

{
  ostream *poVar1;
  int *in_RDI;
  rep_conflict rVar2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff18;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff28;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff30;
  duration<double,_std::ratio<1L,_1L>_> local_60 [2];
  undefined8 local_50;
  rep local_48;
  duration<double,_std::ratio<1L,_1L>_> local_40 [4];
  int *local_20;
  
  local_20 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_20);
  poVar1 = std::operator<<(poVar1," begin: ");
  local_50 = std::chrono::_V2::system_clock::now();
  local_48 = (rep)std::chrono::operator-(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1208b8);
  *local_20 = *local_20 + 1;
  fun(SUB81((ulong)poVar1 >> 0x38,0),(int)poVar1);
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_20);
  poVar1 = std::operator<<(poVar1," end: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_60);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1209c9);
  LOCK();
  x.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)(x.super___atomic_base<int>._M_i + 1)._M_i;
  UNLOCK();
  return;
}

Assistant:

void f1(int a[10])
{ 
  LOG("f1 " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count()); 
  a[0]++;
  fun(true);
  LOG("f1 " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  x.fetch_add(1);
}